

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O3

void * ngx_hash_find_wc_tail(ngx_hash_wildcard_t *hwc,u_char *name,size_t len)

{
  void *pvVar1;
  ngx_uint_t key;
  size_t len_00;
  
  if (len == 0) {
    len_00 = 0;
    key = 0;
LAB_00114a97:
    if (len_00 == len) {
      pvVar1 = (void *)0x0;
    }
    else {
      pvVar1 = ngx_hash_find(&hwc->hash,key,name,len_00);
      if (pvVar1 != (void *)0x0) {
        if (((ulong)pvVar1 & 2) == 0) {
          return pvVar1;
        }
        hwc = (ngx_hash_wildcard_t *)((ulong)pvVar1 & 0xfffffffffffffffc);
        pvVar1 = ngx_hash_find_wc_tail(hwc,name + len_00 + 1,len - (len_00 + 1));
        if (pvVar1 != (void *)0x0) {
          return pvVar1;
        }
      }
      pvVar1 = hwc->value;
    }
  }
  else {
    pvVar1 = (void *)0x0;
    key = 0;
    len_00 = 0;
    do {
      if ((ulong)name[len_00] == 0x2e) goto LAB_00114a97;
      key = key * 0x1f + (ulong)name[len_00];
      len_00 = len_00 + 1;
    } while (len != len_00);
  }
  return pvVar1;
}

Assistant:

void *
ngx_hash_find_wc_tail(ngx_hash_wildcard_t *hwc, u_char *name, size_t len)
{
    void        *value;
    ngx_uint_t   i, key;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "wct:\"%*s\"", len, name);
#endif

    key = 0;

    for (i = 0; i < len; i++) {
        if (name[i] == '.') {
            break;
        }

        key = ngx_hash(key, name[i]);
    }

    if (i == len) {
        return NULL;
    }

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "key:\"%ui\"", key);
#endif

    value = ngx_hash_find(&hwc->hash, key, name, i);

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "value:\"%p\"", value);
#endif

    if (value) {

        /*
         * the 2 low bits of value have the special meaning:
         *     00 - value is data pointer;
         *     11 - value is pointer to wildcard hash allowing "example.*".
         */

        if ((uintptr_t) value & 2) {

            i++;

            hwc = (ngx_hash_wildcard_t *) ((uintptr_t) value & (uintptr_t) ~3);

            value = ngx_hash_find_wc_tail(hwc, &name[i], len - i);

            if (value) {
                return value;
            }

            return hwc->value;
        }

        return value;
    }

    return hwc->value;
}